

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.hpp
# Opt level: O0

span<int,_18446744073709551615UL> __thiscall
nonstd::span_lite::span<int,_18446744073709551615UL>::last
          (span<int,_18446744073709551615UL> *this,size_type count)

{
  span<int,_18446744073709551615UL> sVar1;
  ulong uVar2;
  bool bVar3;
  pointer piVar4;
  size_type sVar5;
  span<int,_18446744073709551615UL> local_38;
  ulong local_28;
  size_type count_local;
  span<int,_18446744073709551615UL> *this_local;
  
  local_28 = count;
  count_local = (size_type)this;
  bVar3 = detail::is_positive<unsigned_long>(count);
  uVar2 = local_28;
  if ((!bVar3) || (sVar5 = size(this), sVar5 < uVar2)) {
    detail::report_contract_violation
              (
              "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]span-lite/include/nonstd/span.hpp:1198: Precondition violation."
              );
  }
  piVar4 = data(this);
  sVar5 = size(this);
  span<int_*,_0>(&local_38,piVar4 + (sVar5 - local_28),local_28);
  sVar1.size_ = local_38.size_;
  sVar1.data_ = local_38.data_;
  return sVar1;
}

Assistant:

span_constexpr_exp span< element_type, dynamic_extent >
    last( size_type count ) const
    {
        span_EXPECTS( detail::is_positive( count ) && count <= size() );

        return span< element_type, dynamic_extent >( data() + ( size() - count ), count );
    }